

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.c
# Opt level: O2

void dumpObject(object *obj,int indent)

{
  object **ppoVar1;
  uint uVar2;
  object **ppoVar3;
  object *poVar4;
  object *poVar5;
  char *pcVar6;
  int i_1;
  int i;
  int iVar7;
  ulong uVar8;
  size_t sStack_30;
  
  iVar7 = 0;
  if (0 < indent) {
    iVar7 = indent;
  }
  while (iVar7 != 0) {
    fputc(0x20,_stderr);
    iVar7 = iVar7 + -1;
  }
  ppoVar1 = &obj->class;
  ppoVar3 = &SmallIntClass;
  if (((ulong)obj & 1) == 0) {
    ppoVar3 = ppoVar1;
  }
  poVar4 = *ppoVar3;
  if (poVar4 == SmallIntClass) {
    fprintf(_stderr,"%d",(ulong)obj >> 1 & 0xffffffff);
    return;
  }
  poVar5 = SmallIntClass;
  if (((ulong)obj & 1) == 0) {
    poVar5 = *ppoVar1;
  }
  if (poVar5 != UndefinedClass) {
    if (poVar4 == SymbolClass) {
      uVar2 = (uint)obj->header;
      pcVar6 = "#%.*s";
    }
    else {
      if (poVar4 != StringClass) {
        if (poVar4 == ArrayClass) {
          fwrite("#(",2,1,_stderr);
          for (uVar8 = 0; uVar8 < (uint)obj->header >> 2; uVar8 = uVar8 + 1) {
            dumpObject((object *)(&obj[1].header)[uVar8],1);
          }
        }
        else {
          if ((obj->header & 2) == 0) {
            uVar2 = *(uint *)poVar4[1].header;
            poVar4 = (object *)((uint *)poVar4[1].header + 4);
            pcVar6 = "%.*s";
            goto LAB_00102f46;
          }
          fprintf(_stderr,"%.*s #(",(ulong)(*(uint *)(*ppoVar1)[1].header >> 2),
                  (uint *)(*ppoVar1)[1].header + 4);
          for (uVar8 = 0; uVar8 < (uint)obj->header >> 2; uVar8 = uVar8 + 1) {
            fprintf(_stderr," %02x",(ulong)*(byte *)((long)&obj[1].header + uVar8));
          }
        }
        pcVar6 = " )";
        sStack_30 = 2;
        goto LAB_00102ef2;
      }
      uVar2 = (uint)obj->header;
      pcVar6 = "\'%.*s\'";
    }
    poVar4 = obj + 1;
LAB_00102f46:
    fprintf(_stderr,pcVar6,(ulong)(uVar2 >> 2),poVar4);
    return;
  }
  pcVar6 = "nil";
  sStack_30 = 3;
LAB_00102ef2:
  fwrite(pcVar6,sStack_30,1,_stderr);
  return;
}

Assistant:

void dumpObject(struct object *obj, int indent)
{
    for(int i=0; i < indent; i++) {
        fputc(' ', stderr);
    }

    if(CLASS(obj) == SmallIntClass) {
        fprintf(stderr, "%d", integerValue(obj));
    } else if(CLASS(obj) == UndefinedClass) {
        fprintf(stderr, "nil");
    } else if(CLASS(obj) == SymbolClass) {
        fprintf(stderr, "#%.*s", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == StringClass) {
        fprintf(stderr, "'%.*s'", SIZE(obj), (char *)bytePtr(obj));
    } else if(CLASS(obj) == ArrayClass) {
        fprintf(stderr, "#(");
        for(int i=0; i < (int)SIZE(obj); i++) {
            dumpObject(obj->data[i], 1);
        }
        fprintf(stderr, " )");
    } else if(IS_BINOBJ(obj)) {
        fprintf(stderr, "%.*s #(", SIZE(obj->class->data[nameInClass]), (char *)bytePtr(obj->class->data[nameInClass]));
        for(int i=0; i < (int)SIZE(obj); i++) {
            fprintf(stderr," %02x", bytePtr(obj)[i]);
        }
        fprintf(stderr, " )");
    } else {
        struct object *cls = CLASS(obj);
        struct object *name = cls->data[nameInClass];

        fprintf(stderr, "%.*s", SIZE(name), (char *)bytePtr(name));
    }
}